

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O1

btDbvtNode * topdown(btDbvt *pdbvt,tNodeArray *leaves,int bu_treshold)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  btDbvt *pdbvt_00;
  btDbvtNode **ppbVar9;
  btDbvtNode **ppbVar10;
  int *piVar11;
  ulong uVar12;
  void *pvVar13;
  btDbvtNode *pbVar14;
  btDbvtNode *pbVar15;
  int i;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  btDbvtNode ***pppbVar19;
  int iVar20;
  btDbvtVolume *ptr;
  int ni;
  uint uVar21;
  long lVar22;
  tNodeArray *ptVar23;
  int i_1;
  int iVar24;
  int iVar25;
  tNodeArray sets [2];
  int splitcount [3] [2];
  undefined8 uStack_10c;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  tNodeArray local_d8;
  tNodeArray *local_b8;
  int local_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  int local_98 [6];
  btDbvt *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (topdown(btDbvt*,btAlignedObjectArray<btDbvtNode*>&,int)::axis == '\0') {
    uStack_100 = 0x134488;
    topdown();
  }
  uVar8 = leaves->m_size;
  uVar12 = (ulong)uVar8;
  if (1 < (int)uVar8) {
    if (bu_treshold < (int)uVar8) {
      ppbVar9 = leaves->m_data;
      pbVar14 = *ppbVar9;
      local_e8 = *(btDbvtNode ***)(pbVar14->volume).mx.m_floats;
      _fStack_e0 = *(undefined8 *)((pbVar14->volume).mx.m_floats + 2);
      local_f8._0_8_ = *(ulong *)(pbVar14->volume).mi.m_floats;
      local_f8._8_8_ = *(ulong *)((pbVar14->volume).mi.m_floats + 2);
      uVar16 = 1;
      do {
        pbVar14 = ppbVar9[uVar16];
        lVar22 = 4;
        do {
          fVar2 = *(float *)((long)(&(pbVar14->volume).mi + -1) + lVar22 * 4);
          pfVar1 = (float *)((long)&uStack_10c + lVar22 * 4 + 4);
          if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
            *(float *)((long)&uStack_10c + lVar22 * 4 + 4) = fVar2;
          }
          fVar2 = (pbVar14->volume).mi.m_floats[lVar22];
          if (*(float *)(local_f8 + lVar22 * 4) <= fVar2) {
            *(float *)(local_f8 + lVar22 * 4) = fVar2;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 7);
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar12);
      local_80 = pdbvt;
      local_ac = bu_treshold;
      fStack_40 = (float)local_f8._8_4_;
      fStack_3c = (float)local_f8._12_4_;
      fVar2 = (float)local_e8;
      local_78 = (float)local_e8;
      fStack_74 = local_e8._4_4_;
      fStack_70 = fStack_e0;
      fStack_6c = fStack_dc;
      fStack_54 = (float)local_f8._4_4_ + local_e8._4_4_;
      fStack_a0 = (float)local_f8._8_4_ + fStack_e0;
      fStack_9c = (float)local_f8._12_4_ + fStack_dc;
      local_58 = fStack_54 * 0.5;
      fStack_50 = fStack_54;
      fStack_4c = fStack_54;
      lVar22 = 0x18;
      local_a8 = fStack_a0;
      fStack_a4 = fStack_9c;
      do {
        local_f8[lVar22] = 1;
        *(undefined8 *)((long)&uStack_100 + lVar22) = 0;
        *(undefined8 *)((long)&uStack_10c + lVar22) = 0;
        lVar22 = lVar22 + 0x20;
      } while (lVar22 != 0x58);
      local_48 = (float)local_f8._0_4_;
      fStack_44 = (float)local_f8._4_4_;
      local_68 = ((float)local_f8._0_4_ + fVar2) * 0.5;
      fStack_64 = (float)local_f8._4_4_;
      fStack_60 = fStack_40;
      fStack_5c = fStack_3c;
      local_a8 = local_a8 * 0.5;
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_98[4] = 0;
      local_98[5] = 0;
      uVar16 = 0;
      do {
        pbVar14 = ppbVar9[uVar16];
        fVar2 = (pbVar14->volume).mi.m_floats[0];
        fVar3 = (pbVar14->volume).mi.m_floats[1];
        fVar4 = (pbVar14->volume).mx.m_floats[0];
        fVar5 = (pbVar14->volume).mx.m_floats[1];
        fVar6 = (pbVar14->volume).mi.m_floats[2];
        fVar7 = (pbVar14->volume).mx.m_floats[2];
        lVar22 = 0;
        do {
          piVar11 = (int *)((long)local_98 +
                           lVar22 + (ulong)(0.0 < *(float *)((long)topdown::axis[0].m_floats +
                                                            lVar22 * 2 + 8) *
                                                  ((fVar6 + fVar7) * 0.5 - local_a8) +
                                                  *(float *)((long)topdown::axis[0].m_floats +
                                                            lVar22 * 2) *
                                                  ((fVar2 + fVar4) * 0.5 - local_68) +
                                                  *(float *)((long)topdown::axis[0].m_floats +
                                                            lVar22 * 2 + 4) *
                                                  ((fVar3 + fVar5) * 0.5 - fStack_54 * 0.5)) * 4);
          *piVar11 = *piVar11 + 1;
          lVar22 = lVar22 + 8;
        } while (lVar22 != 0x18);
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar12);
      uVar16 = 0xffffffff;
      uVar17 = 0;
      do {
        if ((0 < local_98[uVar17 * 2]) && (0 < local_98[uVar17 * 2 + 1])) {
          uVar21 = (uint)ABS((float)(local_98[uVar17 * 2] - local_98[uVar17 * 2 + 1]));
          if ((int)uVar21 < (int)uVar12) {
            uVar16 = uVar17 & 0xffffffff;
          }
          if ((int)uVar21 <= (int)uVar12) {
            uVar12 = (ulong)uVar21;
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 3);
      local_b8 = leaves;
      if ((int)uVar16 < 0) {
        if ((int)local_f8._8_4_ <= (int)(uVar8 >> 1)) {
          lVar22 = (ulong)(uVar8 >> 1) + 1;
          uStack_100 = 0x133e33;
          ppbVar9 = (btDbvtNode **)btAlignedAllocInternal(lVar22 * 8,0x10);
          if (0 < (long)(int)local_f8._4_4_) {
            lVar18 = 0;
            do {
              ppbVar9[lVar18] = local_e8[lVar18];
              lVar18 = lVar18 + 1;
            } while ((int)local_f8._4_4_ != lVar18);
          }
          if ((local_e8 != (btDbvtNode **)0x0) && (fStack_e0._0_1_ == true)) {
            uStack_100 = 0x133e6d;
            btAlignedFreeInternal(local_e8);
          }
          fStack_e0._0_1_ = true;
          local_e8 = ppbVar9;
          local_f8._8_4_ = (int)lVar22;
        }
        iVar20 = local_b8->m_size / 2;
        if (local_d8.m_capacity < iVar20) {
          if (local_b8->m_size + 1U < 3) {
            ppbVar9 = (btDbvtNode **)0x0;
          }
          else {
            uStack_100 = 0x13427f;
            ppbVar9 = (btDbvtNode **)btAlignedAllocInternal((long)iVar20 << 3,0x10);
          }
          if (0 < (long)local_d8.m_size) {
            lVar22 = 0;
            do {
              ppbVar9[lVar22] = local_d8.m_data[lVar22];
              lVar22 = lVar22 + 1;
            } while (local_d8.m_size != lVar22);
          }
          if ((local_d8.m_data != (btDbvtNode **)0x0) && (local_d8.m_ownsMemory == true)) {
            uStack_100 = 0x1342b9;
            btAlignedFreeInternal(local_d8.m_data);
          }
          local_d8.m_ownsMemory = true;
          local_d8.m_data = ppbVar9;
          local_d8.m_capacity = iVar20;
        }
        iVar20 = local_b8->m_size;
        if (0 < (long)iVar20) {
          lVar22 = 0;
          ptVar23 = local_b8;
          do {
            uVar12 = (ulong)(((uint)lVar22 & 1) << 5);
            ppbVar9 = ptVar23->m_data;
            iVar24 = *(int *)(local_f8 + uVar12 + 4);
            if (iVar24 == *(int *)(local_f8 + uVar12 + 8)) {
              iVar25 = iVar24 * 2;
              if (iVar24 == 0) {
                iVar25 = 1;
              }
              if (*(int *)(local_f8 + uVar12 + 8) < iVar25) {
                if (iVar25 == 0) {
                  pvVar13 = (void *)0x0;
                }
                else {
                  uStack_100 = 0x134332;
                  pvVar13 = btAlignedAllocInternal((long)iVar25 << 3,0x10);
                }
                iVar24 = *(int *)(local_f8 + uVar12 + 4);
                if (0 < (long)iVar24) {
                  lVar18 = 0;
                  do {
                    *(undefined8 *)((long)pvVar13 + lVar18 * 8) =
                         *(undefined8 *)(*(long *)((long)&local_e8 + uVar12) + lVar18 * 8);
                    lVar18 = lVar18 + 1;
                  } while (iVar24 != lVar18);
                }
                if (*(void **)((long)&local_e8 + uVar12) != (void *)0x0) {
                  if (*(char *)((long)&fStack_e0 + uVar12) == '\x01') {
                    uStack_100 = 0x13436e;
                    btAlignedFreeInternal(*(void **)((long)&local_e8 + uVar12));
                  }
                  *(undefined8 *)((long)&local_e8 + uVar12) = 0;
                }
                *(undefined1 *)((long)&fStack_e0 + uVar12) = 1;
                *(void **)((long)&local_e8 + uVar12) = pvVar13;
                *(int *)(local_f8 + uVar12 + 8) = iVar25;
                ptVar23 = local_b8;
              }
            }
            iVar24 = *(int *)(local_f8 + uVar12 + 4);
            *(btDbvtNode **)(*(long *)((long)&local_e8 + uVar12) + (long)iVar24 * 8) =
                 ppbVar9[lVar22];
            *(int *)(local_f8 + uVar12 + 4) = iVar24 + 1;
            lVar22 = lVar22 + 1;
          } while (lVar22 != iVar20);
        }
      }
      else {
        iVar20 = local_98[uVar16 * 2];
        if ((int)local_f8._8_4_ < iVar20) {
          if (iVar20 == 0) {
            ppbVar9 = (btDbvtNode **)0x0;
          }
          else {
            uStack_100 = 0x133df6;
            ppbVar9 = (btDbvtNode **)btAlignedAllocInternal((long)iVar20 << 3,0x10);
          }
          if (0 < (long)(int)local_f8._4_4_) {
            lVar22 = 0;
            do {
              ppbVar9[lVar22] = local_e8[lVar22];
              lVar22 = lVar22 + 1;
            } while ((int)local_f8._4_4_ != lVar22);
          }
          if ((local_e8 != (btDbvtNode **)0x0) && (fStack_e0._0_1_ == true)) {
            uStack_100 = 0x133eee;
            btAlignedFreeInternal(local_e8);
          }
          fStack_e0._0_1_ = true;
          local_e8 = ppbVar9;
          local_f8._8_4_ = iVar20;
        }
        iVar20 = local_98[uVar16 * 2 + 1];
        if (local_d8.m_capacity < iVar20) {
          if (iVar20 == 0) {
            ppbVar9 = (btDbvtNode **)0x0;
          }
          else {
            uStack_100 = 0x133f29;
            ppbVar9 = (btDbvtNode **)btAlignedAllocInternal((long)iVar20 << 3,0x10);
          }
          if (0 < (long)local_d8.m_size) {
            lVar22 = 0;
            do {
              ppbVar9[lVar22] = local_d8.m_data[lVar22];
              lVar22 = lVar22 + 1;
            } while (local_d8.m_size != lVar22);
          }
          if ((local_d8.m_data != (btDbvtNode **)0x0) && (local_d8.m_ownsMemory == true)) {
            uStack_100 = 0x133f68;
            btAlignedFreeInternal(local_d8.m_data);
          }
          local_d8.m_ownsMemory = true;
          local_d8.m_data = ppbVar9;
          local_d8.m_capacity = iVar20;
        }
        lVar22 = (long)(int)local_f8._4_4_;
        ptVar23 = local_b8;
        if (lVar22 < 0) {
          if ((int)local_f8._8_4_ < 0) {
            if ((local_e8 != (btDbvtNode **)0x0) && (fStack_e0._0_1_ == true)) {
              uStack_100 = 0x133fab;
              btAlignedFreeInternal(local_e8);
            }
            fStack_e0._0_1_ = true;
            local_e8 = (btDbvtNode **)0x0;
            local_f8._8_8_ = local_f8._8_8_ & 0xffffffff00000000;
            ptVar23 = local_b8;
          }
          do {
            local_e8[lVar22] = (btDbvtNode *)0x0;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0);
        }
        local_f8._0_8_ = local_f8._0_8_ & 0xffffffff;
        lVar22 = (long)local_d8.m_size;
        if (lVar22 < 0) {
          if (local_d8.m_capacity < 0) {
            if ((local_d8.m_data != (btDbvtNode **)0x0) &&
               (ptVar23 = local_b8, local_d8.m_ownsMemory == true)) {
              uStack_100 = 0x134010;
              btAlignedFreeInternal(local_d8.m_data);
              ptVar23 = local_b8;
            }
            local_d8.m_ownsMemory = true;
            local_d8.m_data = (btDbvtNode **)0x0;
            local_d8.m_capacity = 0;
          }
          do {
            local_d8.m_data[lVar22] = (btDbvtNode *)0x0;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0);
        }
        local_d8.m_size = 0;
        iVar20 = ptVar23->m_size;
        if (0 < (long)iVar20) {
          lVar22 = 0;
          do {
            piVar11 = (int *)(local_f8 + 4);
            ppbVar9 = ptVar23->m_data;
            pbVar14 = ppbVar9[lVar22];
            if (0.0 <= (((pbVar14->volume).mi.m_floats[2] + (pbVar14->volume).mx.m_floats[2]) * 0.5
                       - local_a8) * topdown::axis[uVar16].m_floats[2] +
                       (((pbVar14->volume).mi.m_floats[0] + (pbVar14->volume).mx.m_floats[0]) * 0.5
                       - local_68) * topdown::axis[uVar16].m_floats[0] +
                       (((pbVar14->volume).mi.m_floats[1] + (pbVar14->volume).mx.m_floats[1]) * 0.5
                       - local_58) * topdown::axis[uVar16].m_floats[1]) {
              pppbVar19 = &local_d8.m_data;
              piVar11 = &local_d8.m_size;
              if (local_d8.m_size == local_d8.m_capacity) {
                iVar24 = local_d8.m_size * 2;
                if (local_d8.m_size == 0) {
                  iVar24 = 1;
                }
                piVar11 = &local_d8.m_size;
                if (local_d8.m_capacity < iVar24) {
                  if (iVar24 == 0) {
                    ppbVar10 = (btDbvtNode **)0x0;
                  }
                  else {
                    uStack_100 = 0x134179;
                    ppbVar10 = (btDbvtNode **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
                  }
                  if (0 < (long)local_d8.m_size) {
                    lVar18 = 0;
                    do {
                      ppbVar10[lVar18] = local_d8.m_data[lVar18];
                      lVar18 = lVar18 + 1;
                    } while (local_d8.m_size != lVar18);
                  }
                  if ((local_d8.m_data != (btDbvtNode **)0x0) && (local_d8.m_ownsMemory == true)) {
                    uStack_100 = 0x13421e;
                    btAlignedFreeInternal(local_d8.m_data);
                  }
                  local_d8.m_ownsMemory = true;
                  local_d8.m_data = ppbVar10;
                  local_d8.m_capacity = iVar24;
                  pppbVar19 = &local_d8.m_data;
                  piVar11 = &local_d8.m_size;
                  ptVar23 = local_b8;
                }
              }
            }
            else {
              pppbVar19 = (btDbvtNode ***)&local_e8;
              if (local_f8._4_4_ == local_f8._8_4_) {
                iVar24 = local_f8._4_4_ * 2;
                if (local_f8._4_4_ == 0) {
                  iVar24 = 1;
                }
                if ((int)local_f8._8_4_ < iVar24) {
                  if (iVar24 == 0) {
                    ppbVar10 = (btDbvtNode **)0x0;
                  }
                  else {
                    uStack_100 = 0x134127;
                    ppbVar10 = (btDbvtNode **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
                  }
                  if (0 < (long)(int)local_f8._4_4_) {
                    lVar18 = 0;
                    do {
                      ppbVar10[lVar18] = local_e8[lVar18];
                      lVar18 = lVar18 + 1;
                    } while ((int)local_f8._4_4_ != lVar18);
                  }
                  if ((local_e8 != (btDbvtNode **)0x0) && (fStack_e0._0_1_ == true)) {
                    uStack_100 = 0x1341b8;
                    btAlignedFreeInternal(local_e8);
                  }
                  fStack_e0._0_1_ = true;
                  local_e8 = ppbVar10;
                  local_f8._8_4_ = iVar24;
                  pppbVar19 = (btDbvtNode ***)&local_e8;
                  piVar11 = (int *)(local_f8 + 4);
                  ptVar23 = local_b8;
                }
              }
            }
            iVar24 = *piVar11;
            (*pppbVar19)[iVar24] = ppbVar9[lVar22];
            *piVar11 = iVar24 + 1;
            lVar22 = lVar22 + 1;
          } while (lVar22 != iVar20);
        }
      }
      pdbvt_00 = local_80;
      pbVar14 = local_80->m_free;
      if (pbVar14 == (btDbvtNode *)0x0) {
        uStack_100 = 0x1343dc;
        pbVar14 = (btDbvtNode *)btAlignedAllocInternal(0x38,0x10);
        pbVar14->parent = (btDbvtNode *)0x0;
        (pbVar14->field_2).childs[0] = (btDbvtNode *)0x0;
        (pbVar14->volume).mx.m_floats[0] = 0.0;
        (pbVar14->volume).mx.m_floats[1] = 0.0;
        (pbVar14->volume).mx.m_floats[2] = 0.0;
        (pbVar14->volume).mx.m_floats[3] = 0.0;
        (pbVar14->volume).mi.m_floats[0] = 0.0;
        (pbVar14->volume).mi.m_floats[1] = 0.0;
        (pbVar14->volume).mi.m_floats[2] = 0.0;
        (pbVar14->volume).mi.m_floats[3] = 0.0;
        (pbVar14->field_2).childs[1] = (btDbvtNode *)0x0;
      }
      else {
        local_80->m_free = (btDbvtNode *)0x0;
      }
      iVar20 = local_ac;
      pbVar14->parent = (btDbvtNode *)0x0;
      (pbVar14->field_2).childs[0] = (btDbvtNode *)0x0;
      (pbVar14->field_2).childs[1] = (btDbvtNode *)0x0;
      *(ulong *)(pbVar14->volume).mi.m_floats = CONCAT44(fStack_44,local_48);
      *(ulong *)((pbVar14->volume).mi.m_floats + 2) = CONCAT44(fStack_3c,fStack_40);
      *(ulong *)(pbVar14->volume).mx.m_floats = CONCAT44(fStack_74,local_78);
      *(ulong *)((pbVar14->volume).mx.m_floats + 2) = CONCAT44(fStack_6c,fStack_70);
      uStack_100 = 0x13442f;
      pbVar15 = topdown(pdbvt_00,(tNodeArray *)local_f8,local_ac);
      (pbVar14->field_2).childs[0] = pbVar15;
      uStack_100 = 0x134442;
      pbVar15 = topdown(pdbvt_00,&local_d8,iVar20);
      (pbVar14->field_2).childs[1] = pbVar15;
      (pbVar14->field_2).childs[0]->parent = pbVar14;
      (pbVar14->field_2).childs[1]->parent = pbVar14;
      lVar22 = 0x20;
      do {
        uStack_100 = 0x134464;
        btAlignedObjectArray<btDbvtNode_*>::~btAlignedObjectArray
                  ((btAlignedObjectArray<btDbvtNode_*> *)(local_f8 + lVar22));
        lVar22 = lVar22 + -0x20;
      } while (lVar22 != -0x20);
      return pbVar14;
    }
    uStack_100 = 0x133e09;
    bottomup(pdbvt,leaves);
  }
  return *leaves->m_data;
}

Assistant:

static btDbvtNode*			topdown(btDbvt* pdbvt,
									tNodeArray& leaves,
									int bu_treshold)
{
	static const btVector3	axis[]={btVector3(1,0,0),
		btVector3(0,1,0),
		btVector3(0,0,1)};
	if(leaves.size()>1)
	{
		if(leaves.size()>bu_treshold)
		{
			const btDbvtVolume	vol=bounds(leaves);
			const btVector3			org=vol.Center();
			tNodeArray				sets[2];
			int						bestaxis=-1;
			int						bestmidp=leaves.size();
			int						splitcount[3][2]={{0,0},{0,0},{0,0}};
			int i;
			for( i=0;i<leaves.size();++i)
			{
				const btVector3	x=leaves[i]->volume.Center()-org;
				for(int j=0;j<3;++j)
				{
					++splitcount[j][btDot(x,axis[j])>0?1:0];
				}
			}
			for( i=0;i<3;++i)
			{
				if((splitcount[i][0]>0)&&(splitcount[i][1]>0))
				{
					const int	midp=(int)btFabs(btScalar(splitcount[i][0]-splitcount[i][1]));
					if(midp<bestmidp)
					{
						bestaxis=i;
						bestmidp=midp;
					}
				}
			}
			if(bestaxis>=0)
			{
				sets[0].reserve(splitcount[bestaxis][0]);
				sets[1].reserve(splitcount[bestaxis][1]);
				split(leaves,sets[0],sets[1],org,axis[bestaxis]);
			}
			else
			{
				sets[0].reserve(leaves.size()/2+1);
				sets[1].reserve(leaves.size()/2);
				for(int i=0,ni=leaves.size();i<ni;++i)
				{
					sets[i&1].push_back(leaves[i]);
				}
			}
			btDbvtNode*	node=createnode(pdbvt,0,vol,0);
			node->childs[0]=topdown(pdbvt,sets[0],bu_treshold);
			node->childs[1]=topdown(pdbvt,sets[1],bu_treshold);
			node->childs[0]->parent=node;
			node->childs[1]->parent=node;
			return(node);
		}
		else
		{
			bottomup(pdbvt,leaves);
			return(leaves[0]);
		}
	}
	return(leaves[0]);
}